

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall
GdlUnaryExpression::ResolveToInteger(GdlUnaryExpression *this,int *pnRet,bool fSlotRef)

{
  bool bVar1;
  ulong uVar2;
  byte in_DL;
  uint *in_RSI;
  long in_RDI;
  int nTmp;
  string *in_stack_ffffffffffffff50;
  string *sta;
  GrcSymbolTableEntry *in_stack_ffffffffffffff58;
  GrcSymbolTableEntry *this_00;
  undefined1 local_79 [56];
  allocator local_41;
  string local_40 [32];
  int local_20;
  byte local_19;
  uint *local_18;
  bool local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  uVar2 = (**(code **)(**(long **)(in_RDI + 0x40) + 0x38))
                    (*(long **)(in_RDI + 0x40),&local_20,local_19);
  if ((uVar2 & 1) == 0) {
    local_1 = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"!",&local_41);
    bVar1 = GrcSymbolTableEntry::MatchesOp(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      *local_18 = (uint)(local_20 == 0);
    }
    else {
      sta = *(string **)(in_RDI + 0x38);
      this_00 = (GrcSymbolTableEntry *)local_79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_79 + 1),"-",(allocator *)this_00);
      bVar1 = GrcSymbolTableEntry::MatchesOp(this_00,sta);
      std::__cxx11::string::~string((string *)(local_79 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_79);
      if (!bVar1) {
        return false;
      }
      *local_18 = -local_20;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GdlUnaryExpression::ResolveToInteger(int * pnRet, bool fSlotRef)
{

	int nTmp;
	if (!m_pexpOperand->ResolveToInteger(&nTmp, fSlotRef))
		return false;

	if (m_psymOperator->MatchesOp("!"))
		*pnRet = (nTmp == 0)? 1: 0;
	else if (m_psymOperator->MatchesOp("-"))
		*pnRet = nTmp * -1;
	else
		return false;

	return true;
}